

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O3

int Ifd_ManDsdTest4(void)

{
  int iVar1;
  int *__ptr;
  Vec_Int_t *__ptr_00;
  long lVar2;
  int pPerm [6];
  int local_48 [8];
  
  local_48[0] = 0;
  local_48[1] = 1;
  local_48[2] = 2;
  local_48[3] = 3;
  local_48[4] = 4;
  local_48[5] = 5;
  __ptr_00 = Ifd_ManDsdPermJT(6);
  iVar1 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (int *)0x0) goto LAB_0040dfa3;
  }
  else {
    lVar2 = 0;
    do {
      *(ulong *)(local_48 + __ptr[lVar2]) =
           CONCAT44((int)*(undefined8 *)(local_48 + __ptr[lVar2]),
                    (int)((ulong)*(undefined8 *)(local_48 + __ptr[lVar2]) >> 0x20));
      Ifd_ManDsdPermPrint(local_48,6);
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  free(__ptr);
LAB_0040dfa3:
  free(__ptr_00);
  return 1;
}

Assistant:

int Ifd_ManDsdTest4() 
{
    int pPerm[6] = { 0, 1, 2, 3, 4, 5 };
    Vec_Int_t * vGuide = Ifd_ManDsdPermJT( 6 );
    int i, Entry;
    Vec_IntForEachEntry( vGuide, Entry, i )
    {
        ABC_SWAP( int, pPerm[Entry], pPerm[Entry+1] );
        Ifd_ManDsdPermPrint( pPerm, 6 );
    }
    Vec_IntFree( vGuide );
    return 1;
}